

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_3,_4>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int i;
  float *pfVar2;
  int r;
  long lVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  undefined8 local_a8;
  float local_a0 [6];
  float local_88 [2];
  Type in0;
  Vector<float,_3> res_3;
  Vector<float,_3> res_1;
  Matrix<float,_4,_3> retVal;
  Type in1;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_a8 = *(undefined8 *)(evalCtx->coords).m_data;
    local_a0[0] = (evalCtx->coords).m_data[2];
  }
  else {
    local_a8 = 0x3dcccccd3f8ccccd;
    local_a0[0] = 0.5;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    retVal.m_data.m_data[0].m_data[2] = (evalCtx->coords).m_data[0];
    retVal.m_data.m_data[0].m_data[3] = (evalCtx->coords).m_data[1];
    retVal.m_data.m_data[1].m_data[0] = (evalCtx->coords).m_data[2];
    retVal.m_data.m_data[1].m_data[1] = (evalCtx->coords).m_data[3];
  }
  else {
    retVal.m_data.m_data[0].m_data[2] = 0.2;
    retVal.m_data.m_data[0].m_data[3] = -1.0;
    retVal.m_data.m_data[1].m_data[0] = 0.5;
    retVal.m_data.m_data[1].m_data[1] = 0.8;
  }
  pfVar2 = in0.m_data + 2;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  stack0xffffffffffffff88 = (Vec4 *)0x0;
  lVar3 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar6) = uVar7;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    pfVar2 = pfVar2 + 1;
    lVar3 = lVar3 + 0x10;
  } while (lVar5 != 4);
  pfVar2 = in0.m_data + 2;
  lVar3 = 0;
  do {
    fVar1 = in1.m_data[lVar3 + -10];
    lVar5 = 0;
    do {
      pfVar2[lVar5] = *(float *)((long)local_a0 + lVar5 + -8) * fVar1;
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 1;
  } while (lVar3 != 4);
  pfVar2 = retVal.m_data.m_data[1].m_data + 2;
  in1.m_data[2] = 0.0;
  in1.m_data[3] = 0.0;
  retVal.m_data.m_data[2].m_data[2] = 0.0;
  retVal.m_data.m_data[2].m_data[3] = 0.0;
  in1.m_data[0] = 0.0;
  in1.m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[2] = 0.0;
  retVal.m_data.m_data[1].m_data[3] = 0.0;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  lVar3 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar3 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar6) = uVar7;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x30);
    lVar5 = lVar5 + 1;
    pfVar2 = pfVar2 + 1;
    lVar3 = lVar3 + 0xc;
  } while (lVar5 != 3);
  pfVar2 = retVal.m_data.m_data[1].m_data + 2;
  pfVar4 = in0.m_data + 2;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(float *)((long)pfVar2 + lVar5) = pfVar4[lVar5];
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0xc);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 3;
    pfVar4 = pfVar4 + 1;
  } while (lVar3 != 4);
  in0.m_data[0] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  lVar3 = 0;
  do {
    in0.m_data[lVar3 + -2] = in1.m_data[lVar3 + -6] + in1.m_data[lVar3 + -3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  stack0xffffffffffffff88 = (Vec4 *)0x0;
  lVar3 = 0;
  do {
    in0.m_data[lVar3 + 2] = in0.m_data[lVar3 + -2] + in1.m_data[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_a0[4] = 0.0;
  local_a0[2] = 0.0;
  local_a0[3] = 0.0;
  lVar3 = 0;
  do {
    local_a0[lVar3 + 2] = in0.m_data[lVar3 + 2] + in1.m_data[lVar3 + 3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  stack0xffffffffffffff88 = &evalCtx->color;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[(int)in0.m_data[lVar3 + 2]] = local_a0[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}